

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_types.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::TestAllTypesBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  pointer pTVar1;
  bool use_large_enum;
  iterator iVar2;
  pointer pTVar3;
  pointer __x;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::TestAllTypesBindData_*,_false> local_70;
  key_type local_68;
  vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> local_48;
  
  local_70._M_head_impl = (TestAllTypesBindData *)operator_new(0x38);
  ((local_70._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)0x0;
  ((local_70._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_70._M_head_impl)->super_TableFunctionData).column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_70._M_head_impl)->super_TableFunctionData).column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  ((local_70._M_head_impl)->test_types).
  super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_70._M_head_impl)->test_types).
  super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_70._M_head_impl)->test_types).
  super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_70._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__TestAllTypesBindData_02494638;
  this_00 = &input->named_parameters->_M_h;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"use_large_enum","");
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(this_00,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
      ._M_cur == (__node_type *)0x0) {
    use_large_enum = false;
  }
  else {
    use_large_enum =
         BooleanValue::Get((Value *)((long)iVar2.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                           ._M_cur + 0x28));
  }
  TestAllTypesFun::GetTestTypes((vector<duckdb::TestType,_true> *)&local_48,use_large_enum);
  pTVar3 = unique_ptr<duckdb::TestAllTypesBindData,_std::default_delete<duckdb::TestAllTypesBindData>,_true>
           ::operator->((unique_ptr<duckdb::TestAllTypesBindData,_std::default_delete<duckdb::TestAllTypesBindData>,_true>
                         *)&local_70);
  local_68._M_dataplus._M_p =
       (pointer)(pTVar3->test_types).
                super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
                super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_68._M_string_length =
       (size_type)
       (pTVar3->test_types).super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
       super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.field_2._M_allocated_capacity =
       (size_type)
       (pTVar3->test_types).super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
       super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pTVar3->test_types).super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pTVar3->test_types).super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pTVar3->test_types).super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>::~vector
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)&local_68);
  ::std::vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>::~vector(&local_48);
  pTVar3 = unique_ptr<duckdb::TestAllTypesBindData,_std::default_delete<duckdb::TestAllTypesBindData>,_true>
           ::operator->((unique_ptr<duckdb::TestAllTypesBindData,_std::default_delete<duckdb::TestAllTypesBindData>,_true>
                         *)&local_70);
  pTVar1 = (pTVar3->test_types).super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
           super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (pTVar3->test_types).super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
             super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pTVar1; __x = __x + 1) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&return_types->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&__x->type);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)names,&__x->name);
  }
  *(TestAllTypesBindData **)this = local_70._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> TestAllTypesBind(ClientContext &context, TableFunctionBindInput &input,
                                                 vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<TestAllTypesBindData>();
	bool use_large_enum = false;
	auto entry = input.named_parameters.find("use_large_enum");
	if (entry != input.named_parameters.end()) {
		use_large_enum = BooleanValue::Get(entry->second);
	}
	result->test_types = TestAllTypesFun::GetTestTypes(use_large_enum);
	for (auto &test_type : result->test_types) {
		return_types.push_back(test_type.type);
		names.push_back(test_type.name);
	}
	return std::move(result);
}